

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  string *initial_value;
  string *psVar4;
  long lVar5;
  Rep *pRVar6;
  EnumValueDescriptorProto *proto_00;
  EnumDescriptorProto_EnumReservedRange *pEVar7;
  EnumOptions *pEVar8;
  EnumOptions *pEVar9;
  long lVar10;
  Arena *pAVar11;
  long lVar12;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar11 = (Arena *)(proto->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
  }
  psVar4 = (proto->name_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar11,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar12 = 0;
    lVar10 = 0;
    do {
      lVar5 = *(long *)(this + 0x30);
      pRVar6 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002d2d0d:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->value_).super_RepeatedPtrFieldBase,
                   (proto->value_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002d2d1b:
        pRVar6 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        proto_00 = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                             ((proto->value_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
        (proto->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = proto_00;
      }
      else {
        iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->value_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002d2d0d;
          goto LAB_002d2d1b;
        }
        (proto->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (EnumValueDescriptorProto *)pRVar6->elements[iVar1];
      }
      EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar5 + lVar12),proto_00);
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x28;
    } while (lVar10 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar10 = 0;
    do {
      pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002d2d91:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->reserved_range_).super_RepeatedPtrFieldBase,
                   (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002d2d9f:
        pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        pEVar7 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                           ((proto->reserved_range_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = pEVar7;
      }
      else {
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size ==
              (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002d2d91;
          goto LAB_002d2d9f;
        }
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pEVar7 = (EnumDescriptorProto_EnumReservedRange *)pRVar6->elements[iVar1];
      }
      lVar12 = *(long *)(this + 0x40);
      iVar2 = *(int32 *)(lVar12 + lVar10 * 8);
      uVar3 = (pEVar7->_has_bits_).has_bits_[0];
      (pEVar7->_has_bits_).has_bits_[0] = uVar3 | 1;
      pEVar7->start_ = iVar2;
      iVar2 = *(int32 *)(lVar12 + 4 + lVar10 * 8);
      (pEVar7->_has_bits_).has_bits_[0] = uVar3 | 3;
      pEVar7->end_ = iVar2;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x38));
  }
  if (0 < *(int *)(this + 0x3c)) {
    lVar10 = 0;
    do {
      EnumDescriptorProto::add_reserved_name
                (proto,*(string **)(*(long *)(this + 0x48) + lVar10 * 8));
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x3c));
  }
  pEVar9 = *(EnumOptions **)(this + 0x20);
  pEVar8 = EnumOptions::default_instance();
  if (pEVar9 != pEVar8) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    if (proto->options_ == (EnumOptions *)0x0) {
      pAVar11 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      pEVar9 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar11);
      proto->options_ = pEVar9;
    }
    EnumOptions::CopyFrom(proto->options_,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}